

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O2

void __thiscall
NJamSpell::TSpellCorrector::FilterCandidatesByFrequency
          (TSpellCorrector *this,
          unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
          *uniqueCandidates,TWord origWord)

{
  size_t sVar1;
  pointer ppVar2;
  TWordId wid;
  __node_base *p_Var3;
  long lVar4;
  size_t i;
  ulong uVar5;
  undefined1 local_78 [8];
  TWord origWord_local;
  vector<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
  candidateCounts;
  wchar_t *local_48;
  _Hash_node_base *p_Stack_40;
  unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
  *__range1;
  
  origWord_local.Ptr = (wchar_t *)origWord.Len;
  local_78 = (undefined1  [8])origWord.Ptr;
  if (this->MaxCandiatesToCheck < (uniqueCandidates->_M_h)._M_element_count) {
    candidateCounts.
    super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    origWord_local.Len = 0;
    candidateCounts.
    super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    p_Var3 = &(uniqueCandidates->_M_h)._M_before_begin;
    while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
      wid = TLangModel::GetWordIdNoCreate(&this->LangModel,(TWord *)(p_Var3 + 1));
      candidateCounts.
      super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           TLangModel::GetWordCount(&this->LangModel,wid);
      local_48 = ((TWord *)(p_Var3 + 1))->Ptr;
      p_Stack_40 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
      std::
      vector<std::pair<unsigned_int,NJamSpell::TWord>,std::allocator<std::pair<unsigned_int,NJamSpell::TWord>>>
      ::emplace_back<std::pair<unsigned_int,NJamSpell::TWord>>
                ((vector<std::pair<unsigned_int,NJamSpell::TWord>,std::allocator<std::pair<unsigned_int,NJamSpell::TWord>>>
                  *)&origWord_local.Len,
                 (pair<unsigned_int,_NJamSpell::TWord> *)
                 &candidateCounts.
                  super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    _Hashtable<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&uniqueCandidates->_M_h);
    ppVar2 = candidateCounts.
             super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar1 = origWord_local.Len;
    if ((pointer)origWord_local.Len !=
        candidateCounts.
        super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_NJamSpell::TWord>_*,_std::vector<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>_>,_std::pair<unsigned_int,_NJamSpell::TWord>_>
      ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_NJamSpell::TWord>_*,_std::vector<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>_>,_std::pair<unsigned_int,_NJamSpell::TWord>_>
                           *)&candidateCounts.
                              super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (__normal_iterator<std::pair<unsigned_int,_NJamSpell::TWord>_*,_std::vector<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>_>
                           )origWord_local.Len,
                          ((long)((long)candidateCounts.
                                        super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start -
                                 origWord_local.Len) / 0x18 + 1) / 2);
      if (p_Stack_40 == (_Hash_node_base *)0x0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,NJamSpell::TWord>*,std::vector<std::pair<unsigned_int,NJamSpell::TWord>,std::allocator<std::pair<unsigned_int,NJamSpell::TWord>>>>,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::FilterCandidatesByFrequency(std::unordered_set<NJamSpell::TWord,NJamSpell::TWordHashPtr,std::equal_to<NJamSpell::TWord>,std::allocator<NJamSpell::TWord>>&,NJamSpell::TWord)const::__0>>
                  (sVar1,ppVar2);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,NJamSpell::TWord>*,std::vector<std::pair<unsigned_int,NJamSpell::TWord>,std::allocator<std::pair<unsigned_int,NJamSpell::TWord>>>>,std::pair<unsigned_int,NJamSpell::TWord>*,long,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::FilterCandidatesByFrequency(std::unordered_set<NJamSpell::TWord,NJamSpell::TWordHashPtr,std::equal_to<NJamSpell::TWord>,std::allocator<NJamSpell::TWord>>&,NJamSpell::TWord)const::__0>>
                  (sVar1,ppVar2,p_Stack_40,local_48);
      }
      operator_delete(p_Stack_40);
    }
    lVar4 = 8;
    for (uVar5 = 0; uVar5 < this->MaxCandiatesToCheck; uVar5 = uVar5 + 1) {
      std::__detail::
      _Insert_base<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)uniqueCandidates,(value_type *)(origWord_local.Len + lVar4));
      lVar4 = lVar4 + 0x18;
    }
    std::__detail::
    _Insert_base<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)uniqueCandidates,(value_type *)local_78);
    std::
    _Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
    ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
                     *)&origWord_local.Len);
  }
  return;
}

Assistant:

void TSpellCorrector::FilterCandidatesByFrequency(std::unordered_set<TWord, TWordHashPtr>& uniqueCandidates, TWord origWord) const {
    if (uniqueCandidates.size() <= MaxCandiatesToCheck) {
        return;
    }

    using TCountCand = std::pair<TCount, TWord>;
    std::vector<TCountCand> candidateCounts;
    for (auto&& c: uniqueCandidates) {
        TCount cnt = LangModel.GetWordCount(LangModel.GetWordIdNoCreate(c));
        candidateCounts.push_back(std::make_pair(cnt, c));
    }
    uniqueCandidates.clear();
    std::stable_sort(candidateCounts.begin(), candidateCounts.end(), [](const TCountCand& a, const TCountCand& b) {
        return a.first > b.first;
    });

    for (size_t i = 0; i < MaxCandiatesToCheck; ++ i) {
        uniqueCandidates.insert(candidateCounts[i].second);
    }
    uniqueCandidates.insert(origWord);
}